

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_expr.cpp
# Opt level: O3

Expr * __thiscall
nivalis::Expr::diff(Expr *__return_storage_ptr__,Expr *this,uint64_t var_addr,Environment *env)

{
  pointer pAVar1;
  bool bVar2;
  Differentiator diff;
  Differentiator DStack_188;
  
  Expr(__return_storage_ptr__);
  pAVar1 = (__return_storage_ptr__->ast).
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((__return_storage_ptr__->ast).
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_finish != pAVar1) {
    (__return_storage_ptr__->ast).
    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
    super__Vector_impl_data._M_finish = pAVar1;
  }
  anon_unknown_3::Differentiator::Differentiator
            (&DStack_188,&this->ast,var_addr,env,&__return_storage_ptr__->ast);
  bVar2 = anon_unknown_3::Differentiator::diff(&DStack_188,(ASTNode **)0x0,0xffffffff);
  if (bVar2) {
    optimize(__return_storage_ptr__,5);
  }
  else {
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::resize
              (&__return_storage_ptr__->ast,1);
    ((__return_storage_ptr__->ast).
     super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
     super__Vector_impl_data._M_start)->opcode = 0;
  }
  anon_unknown_3::Differentiator::~Differentiator(&DStack_188);
  return __return_storage_ptr__;
}

Assistant:

Expr Expr::diff(uint64_t var_addr, Environment& env) const {
    Expr dexpr;
    dexpr.ast.clear();

    Differentiator diff(ast, var_addr, env, dexpr.ast);
    if (!diff.diff()) {
        dexpr.ast.resize(1);
        dexpr.ast[0].opcode = OpCode::null;
    } else {
        dexpr.optimize();
    }
    return dexpr;
}